

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall dd::ProcessThreadImpl::WakeUp(ProcessThreadImpl *this,Module *module)

{
  bool bVar1;
  reference pMVar2;
  ModuleCallback *m;
  iterator __end2;
  iterator __begin2;
  ModuleList *__range2;
  AutoLock l;
  Module *module_local;
  ProcessThreadImpl *this_local;
  
  l._lock = (Lock *)module;
  AutoLock::AutoLock((AutoLock *)&__range2,&this->_lock);
  __end2 = std::__cxx11::
           list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
           ::begin(&this->_modules);
  m = (ModuleCallback *)
      std::__cxx11::
      list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
      ::end(&this->_modules);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&m);
    if (!bVar1) break;
    pMVar2 = std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator*(&__end2);
    if ((Lock *)pMVar2->module == l._lock) {
      pMVar2->next_callback = -1;
    }
    std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator++(&__end2);
  }
  AutoLock::~AutoLock((AutoLock *)&__range2);
  Event::Set(&this->_wake_up);
  return;
}

Assistant:

void ProcessThreadImpl::WakeUp(Module* module) {
		{
			AutoLock l(_lock);
			for (ModuleCallback& m : _modules){
				if (m.module == module)
					m.next_callback = kCallProcessImmediately;
			}
		}
		_wake_up.Set();
	}